

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void writePlannerStats(vector<PlannerStats,_std::allocator<PlannerStats>_> *s,FILE *fout)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  size_type sVar4;
  reference pvVar5;
  FILE *in_RSI;
  vector<PlannerStats,_std::allocator<PlannerStats>_> *in_RDI;
  uint i;
  uint local_14;
  
  fprintf(in_RSI,"%%eps time expands cost\n");
  local_14 = 0;
  while( true ) {
    sVar4 = std::vector<PlannerStats,_std::allocator<PlannerStats>_>::size(in_RDI);
    if (sVar4 <= local_14) break;
    pvVar5 = std::vector<PlannerStats,_std::allocator<PlannerStats>_>::operator[]
                       (in_RDI,(ulong)local_14);
    dVar1 = pvVar5->eps;
    pvVar5 = std::vector<PlannerStats,_std::allocator<PlannerStats>_>::operator[]
                       (in_RDI,(ulong)local_14);
    dVar2 = pvVar5->time;
    pvVar5 = std::vector<PlannerStats,_std::allocator<PlannerStats>_>::operator[]
                       (in_RDI,(ulong)local_14);
    uVar3 = pvVar5->expands;
    pvVar5 = std::vector<PlannerStats,_std::allocator<PlannerStats>_>::operator[]
                       (in_RDI,(ulong)local_14);
    fprintf(in_RSI,"%f %f %d %d\n",dVar1,dVar2,(ulong)uVar3,(ulong)(uint)pvVar5->cost);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void writePlannerStats(vector<PlannerStats> s, FILE* fout)
{
    fprintf(fout, "%%eps time expands cost\n");
    for (unsigned int i = 0; i < s.size(); i++) {
        fprintf(fout, "%f %f %d %d\n", s[i].eps, s[i].time, s[i].expands, s[i].cost);
    }
}